

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_mysql.cpp
# Opt level: O3

QVariant * __thiscall QMYSQLResult::handle(QVariant *__return_storage_ptr__,QMYSQLResult *this)

{
  long lVar1;
  void *pvVar2;
  InterfaceType *pIVar3;
  
  lVar1 = *(long *)&this->field_0x8;
  if (*(char *)(lVar1 + 0xfd) == '\x01') {
    if (*(long *)(lVar1 + 0xe0) == 0) {
      pvVar2 = (void *)(lVar1 + 0xd8);
      pIVar3 = &QtPrivate::QMetaTypeInterfaceWrapper<MYSQL_STMT_*>::metaType;
      goto LAB_00109a54;
    }
    pvVar2 = (void *)(lVar1 + 0xe0);
  }
  else {
    pvVar2 = (void *)(lVar1 + 0xb0);
  }
  pIVar3 = &QtPrivate::QMetaTypeInterfaceWrapper<MYSQL_RES_*>::metaType;
LAB_00109a54:
  QVariant::QVariant(__return_storage_ptr__,(QMetaType)pIVar3,pvVar2);
  return __return_storage_ptr__;
}

Assistant:

QVariant QMYSQLResult::handle() const
{
    Q_D(const QMYSQLResult);
    if (d->preparedQuery)
        return d->meta ? QVariant::fromValue(d->meta) : QVariant::fromValue(d->stmt);
    else
        return QVariant::fromValue(d->result);
}